

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

int Bac_NtkBuildLibrary(Bac_Man_t *p)

{
  Mio_Library_t *pLib;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib == (Mio_Library_t *)0x0) {
    puts("The standard cell library is not available.");
  }
  else {
    Bac_NtkPrepareLibrary(p,pLib);
  }
  p->pMioLib = pLib;
  return (uint)(pLib != (Mio_Library_t *)0x0);
}

Assistant:

int Bac_NtkBuildLibrary( Bac_Man_t * p )
{
    int RetValue = 1;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
        printf( "The standard cell library is not available.\n" ), RetValue = 0;
    else
        Bac_NtkPrepareLibrary( p, pLib );
    p->pMioLib = pLib;
    return RetValue;
}